

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall TPZManVector<float,_1000>::~TPZManVector(TPZManVector<float,_1000> *this)

{
  ~TPZManVector(this);
  operator_delete(this,0xfc0);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}